

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O2

void arg_hashtable_insert(arg_hashtable_t *h,void *k,void *v)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  arg_hashtable_entry **ppaVar4;
  arg_hashtable_entry *paVar5;
  size_t size;
  ulong uVar6;
  double dVar7;
  
  if ((h->loadlimit < h->entrycount + 1) && (h->primeindex != 0x19)) {
    uVar3 = h->primeindex + 1;
    h->primeindex = uVar3;
    uVar3 = primes[uVar3];
    size = (ulong)uVar3 << 3;
    ppaVar4 = (arg_hashtable_entry **)argtable3_xmalloc(size);
    memset(ppaVar4,0,size);
    uVar1 = h->tablelength;
    for (uVar6 = 0; uVar6 != uVar1; uVar6 = uVar6 + 1) {
      while( true ) {
        paVar5 = h->table[uVar6];
        if (paVar5 == (arg_hashtable_entry *)0x0) break;
        h->table[uVar6] = paVar5->next;
        uVar2 = (ulong)paVar5->h % (ulong)uVar3;
        paVar5->next = ppaVar4[uVar2];
        ppaVar4[uVar2] = paVar5;
      }
    }
    free(h->table);
    h->table = ppaVar4;
    h->tablelength = uVar3;
    dVar7 = ceil((double)uVar3 * 0.6499999761581421);
    h->loadlimit = (uint)(long)dVar7;
  }
  paVar5 = (arg_hashtable_entry *)argtable3_xmalloc(0x20);
  uVar3 = enhanced_hash(h,k);
  paVar5->h = uVar3;
  uVar6 = (ulong)uVar3 % (ulong)h->tablelength;
  paVar5->k = k;
  paVar5->v = v;
  ppaVar4 = h->table;
  paVar5->next = ppaVar4[uVar6];
  ppaVar4[uVar6] = paVar5;
  h->entrycount = h->entrycount + 1;
  return;
}

Assistant:

void arg_hashtable_insert(arg_hashtable_t* h, void* k, void* v) {
    /* This method allows duplicate keys - but they shouldn't be used */
    unsigned int index;
    struct arg_hashtable_entry* e;
    if ((h->entrycount + 1) > h->loadlimit) {
        /*
         * Ignore the return value. If expand fails, we should
         * still try cramming just this value into the existing table
         * -- we may not have memory for a larger table, but one more
         * element may be ok. Next time we insert, we'll try expanding again.
         */
        arg_hashtable_expand(h);
    }
    e = (struct arg_hashtable_entry*)xmalloc(sizeof(struct arg_hashtable_entry));
    e->h = enhanced_hash(h, k);
    index = index_for(h->tablelength, e->h);
    e->k = k;
    e->v = v;
    e->next = h->table[index];
    h->table[index] = e;
    h->entrycount++;
}